

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cpp
# Opt level: O3

TypeRef __thiscall clickhouse::Block::Iterator::Type(Iterator *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  ArrayImpl *pAVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  element_type *in_RDI;
  TypeRef TVar5;
  TypeRef TVar6;
  
  lVar2 = (long)(this->block_->columns_).
                super__Vector_base<clickhouse::Block::ColumnItem,_std::allocator<clickhouse::Block::ColumnItem>_>
                ._M_impl.super__Vector_impl_data._M_start[this->idx_].column.
                super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var4._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar2 + 0x18);
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)in_RDI = _Var4._M_pi;
  pAVar3 = *(ArrayImpl **)(lVar2 + 0x20);
  (in_RDI->field_1).array_ = pAVar3;
  if (pAVar3 != (ArrayImpl *)0x0) {
    _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1 = &(pAVar3->item_type).super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      TVar5.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      TVar5.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (TypeRef)TVar5.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var1 = &(pAVar3->item_type).super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
    UNLOCK();
  }
  TVar6.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  TVar6.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (TypeRef)TVar6.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TypeRef Block::Iterator::Type() const {
    return block_.columns_[idx_].column->Type();
}